

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

iterator_base<true> * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::
make_begin_iterator<pstore::database_const&,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const&,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
          (iterator_base<true> *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,
          hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *m)

{
  bool bVar1;
  array_stack<pstore::index::details::parent_type,_13UL> local_100;
  undefined1 local_21;
  database *local_20;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *m_local;
  database *db_local;
  iterator_base<true> *result;
  
  local_21 = 0;
  local_20 = db;
  m_local = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             *)this;
  db_local = (database *)__return_storage_ptr__;
  memset(&local_100,0,0xd8);
  array_stack<pstore::index::details::parent_type,_13UL>::array_stack(&local_100);
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::iterator_base<true>::iterator_base
            (__return_storage_ptr__,(database_reference)this,&local_100,
             (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *)local_20);
  bVar1 = details::index_pointer::is_empty
                    ((index_pointer *)
                     &(local_20->storage_).file_.
                      super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (!bVar1) {
    hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::move_to_left_most_child
              (__return_storage_ptr__,
               (index_pointer)
               (local_20->storage_).file_.
               super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Iterator hamt_map<KeyType, ValueType, Hash, KeyEqual>::make_begin_iterator (Database && db,
                                                                                    HamtMap && m) {
            Iterator result{db, parent_stack (), &m};
            if (!m.root_.is_empty ()) {
                result.move_to_left_most_child (m.root_);
            }
            return result;
        }